

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O2

void __thiscall ki::protocol::net::ClientSession::on_keep_alive_response(ClientSession *this)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  long lVar3;
  
  Session::read_data<ki::protocol::control::ClientKeepAlive>((Session *)&stack0xffffffffffffffe0);
  lVar3 = std::chrono::_V2::steady_clock::now();
  pp_Var1 = this->_vptr_ClientSession;
  p_Var2 = pp_Var1[-3];
  *(short *)(&this->field_0x3a + (long)p_Var2) =
       (short)((lVar3 - *(long *)(&this->field_0x30 + (long)p_Var2)) / 1000000);
  (&this->field_0x38)[(long)pp_Var1[-3]] = 0;
  return;
}

Assistant:

void ClientSession::on_keep_alive_response()
	{
		// Read the payload data into a structure
		try
		{
			// We don't actually need the data inside, but
			// read it to check if the structure is right.
			read_data<control::ClientKeepAlive>();
		}
		catch (parse_error &e)
		{
			// The KEEP_ALIVE_RSP wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Calculate latency and allow for KEEP_ALIVE packets to be sent again
		m_latency = std::chrono::duration_cast<std::chrono::milliseconds>(
			std::chrono::steady_clock::now() - m_last_sent_heartbeat_time
		).count();
		m_waiting_for_keep_alive_response = false;
	}